

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O2

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort8
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  uint8_t *puVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  uchar **ppuVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  undefined7 in_register_00000081;
  size_t i_1;
  size_t cnt [256];
  
  memset(cnt,0,0x800);
  ppuVar4 = this->temp_;
  ppuVar3 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar4 = this->data_;
    ppuVar3 = this->temp_;
  }
  puVar1 = this->letters8_;
  for (sVar5 = bgn; sVar7 = bgn, end != sVar5; sVar5 = sVar5 + 1) {
    puVar1[sVar5] = ppuVar3[sVar5][depth];
  }
  for (; end != sVar7; sVar7 = sVar7 + 1) {
    cnt[puVar1[sVar7]] = cnt[puVar1[sVar7]] + 1;
  }
  sVar5 = 0;
  for (lVar6 = 0; sVar7 = bgn, lVar6 != 0x100; lVar6 = lVar6 + 1) {
    sVar7 = cnt[lVar6];
    cnt[lVar6] = sVar5;
    sVar5 = sVar7 + sVar5;
  }
  for (; end != sVar7; sVar7 = sVar7 + 1) {
    sVar5 = cnt[puVar1[sVar7]];
    cnt[puVar1[sVar7]] = sVar5 + 1;
    puVar2 = ppuVar4[bgn + sVar5];
    ppuVar4[bgn + sVar5] = ppuVar3[sVar7];
    ppuVar3[sVar7] = puVar2;
  }
  if (!flip) {
    for (sVar5 = 0; cnt[0] != sVar5; sVar5 = sVar5 + 1) {
      puVar2 = ppuVar3[bgn + sVar5];
      ppuVar3[bgn + sVar5] = ppuVar4[bgn + sVar5];
      ppuVar4[bgn + sVar5] = puVar2;
    }
  }
  for (lVar6 = 1; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    if (cnt[lVar6] != cnt[lVar6 + -1]) {
      Recurse(this,cnt[lVar6 + -1] + bgn,cnt[lVar6] + bgn,depth + 1,!flip);
    }
  }
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort8(size_t bgn, size_t end, size_t depth, bool flip) {
  // Here we do not use |new| or |malloc|. This is because:
  // 1. these may be heavy bottle-necks under multi-thread, and
  // 2. the size is sufficiently small for preventing stack overflow.
  size_t cnt[1 << 8] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint8_t *let = letters8_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    let[i] = src[i][depth];
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 8; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    size_t b = 0, e = cnt[0];
    for (size_t j = b; j < e; ++j) {
      std::swap(src[j], dst[j]);
    }
  }

  for (size_t i = 1; i < 1 << 8; ++i) {
    if (cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 1, !flip);
    }
  }
}